

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3MaterializeView(Parse *pParse,Table *pView,Expr *pWhere,int iCur)

{
  int iVar1;
  SrcList *pSVar2;
  char *pcVar3;
  int in_ECX;
  long in_RSI;
  undefined8 *in_RDI;
  Expr *in_stack_00000018;
  ExprList *in_stack_00000020;
  int iDb;
  sqlite3 *db;
  SrcList *pFrom;
  Select *pSel;
  SelectDest dest;
  u16 in_stack_00000058;
  SelectDest *in_stack_00000218;
  Select *in_stack_00000220;
  Parse *in_stack_00000228;
  Expr *in_stack_ffffffffffffff88;
  Select *p;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff94;
  sqlite3 *in_stack_ffffffffffffff98;
  SrcList *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  SelectDest local_38;
  int local_1c;
  Expr *local_18;
  
  local_1c = in_ECX;
  iVar1 = sqlite3SchemaToIndex((sqlite3 *)*in_RDI,*(Schema **)(in_RSI + 0x70));
  local_18 = sqlite3ExprDup((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                            ,in_stack_ffffffffffffff88,0);
  pSVar2 = sqlite3SrcListAppend
                     ((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0
                      ,(Token *)in_stack_ffffffffffffff98,
                      (Token *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (pSVar2 != (SrcList *)0x0) {
    pcVar3 = sqlite3DbStrDup(in_stack_ffffffffffffff98,
                             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    pSVar2->a[0].zName = pcVar3;
    pcVar3 = sqlite3DbStrDup(in_stack_ffffffffffffff98,
                             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    pSVar2->a[0].zDatabase = pcVar3;
  }
  p = (Select *)0x0;
  uVar4 = 0;
  sqlite3SelectNew((Parse *)dest._0_8_,(ExprList *)pSel,pFrom,(Expr *)db,in_stack_00000020,
                   in_stack_00000018,dest.pOrderBy,in_stack_00000058,pWhere,(Expr *)pView);
  sqlite3SelectDestInit(&local_38,0xc,local_1c);
  sqlite3Select(in_stack_00000228,in_stack_00000220,in_stack_00000218);
  sqlite3SelectDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,uVar4),p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MaterializeView(
  Parse *pParse,       /* Parsing context */
  Table *pView,        /* View definition */
  Expr *pWhere,        /* Optional WHERE clause to be added */
  int iCur             /* Cursor number for ephemeral table */
){
  SelectDest dest;
  Select *pSel;
  SrcList *pFrom;
  sqlite3 *db = pParse->db;
  int iDb = sqlite3SchemaToIndex(db, pView->pSchema);
  pWhere = sqlite3ExprDup(db, pWhere, 0);
  pFrom = sqlite3SrcListAppend(db, 0, 0, 0);
  if( pFrom ){
    assert( pFrom->nSrc==1 );
    pFrom->a[0].zName = sqlite3DbStrDup(db, pView->zName);
    pFrom->a[0].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    assert( pFrom->a[0].pOn==0 );
    assert( pFrom->a[0].pUsing==0 );
  }
  pSel = sqlite3SelectNew(pParse, 0, pFrom, pWhere, 0, 0, 0, 0, 0, 0);
  sqlite3SelectDestInit(&dest, SRT_EphemTab, iCur);
  sqlite3Select(pParse, pSel, &dest);
  sqlite3SelectDelete(db, pSel);
}